

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O0

filename_t * spdlog::details::os::dir_name(filename_t *path)

{
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  filename_t *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  size_type pos;
  filename_t *this;
  
  this = in_RDI;
  __n = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        find_last_of(unaff_retaddr,(char *)in_RDI,(size_type)in_RSI);
  if (__n == 0xffffffffffffffff) {
    std::__cxx11::string::string(in_RSI);
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (this,(size_type)in_RSI,__n);
  }
  return in_RDI;
}

Assistant:

SPDLOG_INLINE filename_t dir_name(const filename_t &path) {
    auto pos = path.find_last_of(folder_seps_filename);
    return pos != filename_t::npos ? path.substr(0, pos) : filename_t{};
}